

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

DesugaredObject * __thiscall
jsonnet::internal::Desugarer::stdlibAST(Desugarer *this,string *filename)

{
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  __last;
  undefined8 uVar1;
  pointer pbVar2;
  DesugaredObject *pDVar3;
  uint uVar4;
  BuiltinFunction *pBVar5;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  _Var6;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *p;
  pointer name_00;
  long lVar7;
  char cVar8;
  long lVar9;
  unsigned_long uVar10;
  string r;
  BuiltinFunction *fn;
  Identifiers params;
  LiteralString *name;
  AST *std_ast;
  Tokens tokens;
  undefined1 local_130 [32];
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_100;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_f0;
  BuiltinFunction *local_d8;
  Hide local_cc;
  vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  local_c8;
  vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
  *local_b0;
  unsigned_long local_a8;
  LiteralString *local_a0;
  string *local_98;
  DesugaredObject *local_90;
  AST *local_88;
  anon_class_56_1_898aa9a8_for__M_pred local_80;
  _List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> local_48;
  
  local_110._M_allocated_capacity = (size_type)&local_100;
  local_98 = filename;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"std.jsonnet","");
  jsonnet_lex((Tokens *)&local_48,(string *)&local_110,
              "/*\nCopyright 2015 Google Inc. All rights reserved.\n\nLicensed under the Apache License, Version 2.0 (the \"License\");\nyou may not use this file except in compliance with the License.\nYou may obtain a copy of the License at\n\n    http://www.apache.org/licenses/LICENSE-2.0\n\nUnless required by applicable law or agreed to in writing, software\ndistributed under the License is distributed on an \"AS IS\" BASIS,\nWITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\nSee the License for the specific language governing permissions and\nlimitations under the License.\n*/\n\n/* This is the Jsonnet standard library, at least the parts of it that are written in Jsonnet.\n *\n * There are some native methods as well, which are defined in the interpreter and added to this\n * file.  It is never necessary to import std.jsonnet, it is embedded into the interpreter at\n * compile-time and automatically imported into all other Jsonnet programs.\n */\n{\n\n  local std = self,\n  local id = function(x) x,\n\n  local go_only_function = error \'This function is only supported in go version of jsonnet. See https://github.com/google/go-jsonnet\',\n\n  isString(v):: std.type(v) == \'string\',\n  isNumber(v):: std.type(v) == \'number\',\n  isBoolean(v):: std.type(v) == \'boolean\',\n  isObject(v):: std.type(v) == \'object\',\n  isArray(v):: std.type(v) == \'array\',\n  isFunction(v):: std.type(v) == \'function\',\n\n  toString(a)::\n    if std.type(a) == \'string\' then a else \'\' + a,\n\n  substr(str, from, len)::\n    assert std.isString(str) : \'substr first parameter should be a string, got \' + std.type(str);\n    assert std.isNumber(from) : \'substr second parameter should be a string, got \' + std.type(from);\n    assert std.isNumber(len) : \'substr third parameter should be a string, got \' + std.type(len);\n    assert len >= 0 : \'substr third parameter should be greater than zero, got \' + len;\n    std.join(\'\', std.makeArray(std.max(0, std.min(len, std.length(str) - from)), function(i) str[i + from])),\n\n  startsWith(a, b)::\n    if std.length(a) < std.length(b) then\n      ..." /* TRUNCATED STRING LITERAL */
             );
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_110._M_allocated_capacity != &local_100) {
    operator_delete((void *)local_110._M_allocated_capacity,local_100._M_allocated_capacity + 1);
  }
  local_88 = jsonnet_parse(this->alloc,(Tokens *)&local_48);
  desugar(this,&local_88,0);
  if ((local_88 != (AST *)0x0) &&
     (local_90 = (DesugaredObject *)
                 __dynamic_cast(local_88,&AST::typeinfo,&DesugaredObject::typeinfo,0),
     local_90 != (DesugaredObject *)0x0)) {
    local_b0 = (vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
                *)&local_90->fields;
    uVar10 = 0;
    do {
      local_a8 = uVar10;
      jsonnet_builtin_decl((BuiltinDecl *)&local_110,uVar10);
      pbVar2 = local_f0.
               super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_c8.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (name_00 = local_f0.
                     super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; name_00 != pbVar2;
          name_00 = name_00 + 1) {
        local_130._0_8_ = Allocator::makeIdentifier(this->alloc,name_00);
        ::std::
        vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
        ::emplace_back<jsonnet::internal::Identifier_const*>
                  ((vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)&local_c8,(Identifier **)local_130);
      }
      local_130._0_4_ = 5;
      local_a0 = Allocator::
                 make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                           (this->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                   *)&local_110,(TokenKind *)local_130,(char (*) [1])0x20bbd7,
                            (char (*) [1])0x20bbd7);
      uVar1 = local_110._M_allocated_capacity;
      local_130._8_8_ = 0;
      local_130[0x10] = '\0';
      local_130._0_8_ = (Identifier *)(local_130 + 0x10);
      if (local_110._8_8_ != 0) {
        lVar7 = local_110._8_8_ << 2;
        lVar9 = 0;
        do {
          uVar4 = *(uint *)(uVar1 + lVar9);
          if (0x10ffff < uVar4) {
            uVar4 = 0xfffd;
          }
          cVar8 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_130;
          if (0x7f < uVar4) {
            if (uVar4 < 0x800) {
              ::std::__cxx11::string::push_back(cVar8);
            }
            else if (uVar4 < 0x10000) {
              ::std::__cxx11::string::push_back(cVar8);
              ::std::__cxx11::string::push_back(cVar8);
            }
            else {
              ::std::__cxx11::string::push_back(cVar8);
              ::std::__cxx11::string::push_back(cVar8);
              ::std::__cxx11::string::push_back(cVar8);
            }
          }
          ::std::__cxx11::string::push_back(cVar8);
          lVar9 = lVar9 + 4;
        } while (lVar7 != lVar9);
      }
      pBVar5 = Allocator::
               make<jsonnet::internal::BuiltinFunction,jsonnet::internal::LocationRange_const&,std::__cxx11::string,std::vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>&>
                         (this->alloc,(LocationRange *)E,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_130,&local_c8);
      pDVar3 = local_90;
      if ((Identifier *)local_130._0_8_ != (Identifier *)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
      }
      _Var6._M_current =
           (pDVar3->fields).
           super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (pDVar3->fields).
           super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_80.decl.name._M_dataplus._M_p = (pointer)&local_80.decl.name.field_2;
      local_d8 = pBVar5;
      ::std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)&local_80,local_110._M_allocated_capacity,
                 local_110._M_allocated_capacity + local_110._8_8_ * 4);
      ::std::
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::vector(&local_80.decl.params,&local_f0);
      _Var6 = ::std::
              find_if<__gnu_cxx::__normal_iterator<jsonnet::internal::DesugaredObject::Field*,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>>,jsonnet::internal::Desugarer::stdlibAST(std::__cxx11::string)::_lambda(jsonnet::internal::DesugaredObject::Field_const&)_1_>
                        (_Var6,__last,&local_80);
      ::std::
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::~vector(&local_80.decl.params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_80.decl.name._M_dataplus._M_p != &local_80.decl.name.field_2) {
        operator_delete(local_80.decl.name._M_dataplus._M_p,
                        local_80.decl.name.field_2._M_allocated_capacity * 4 + 4);
      }
      if (_Var6._M_current ==
          (pDVar3->fields).
          super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
        ::std::
        vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
        ::
        emplace_back<jsonnet::internal::ObjectField::Hide,jsonnet::internal::LiteralString*&,jsonnet::internal::BuiltinFunction*&>
                  (local_b0,(Hide *)local_130,&local_a0,&local_d8);
      }
      else {
        (_Var6._M_current)->body = &local_d8->super_AST;
      }
      uVar10 = local_a8;
      if (local_c8.
          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::~vector(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_110._M_allocated_capacity != &local_100) {
        operator_delete((void *)local_110._M_allocated_capacity,
                        local_100._M_allocated_capacity * 4 + 4);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x29);
    local_cc = HIDDEN;
    local_110._M_allocated_capacity = (size_type)&local_100;
    ::std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)&local_110,L"thisFile",L"");
    local_130._0_4_ = 5;
    local_c8.
    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)Allocator::
                  make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                            (this->alloc,(LocationRange *)E,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                    *)&local_110,(TokenKind *)local_130,(char (*) [1])0x20bbd7,
                             (char (*) [1])0x20bbd7);
    decode_utf8((UString *)local_130,local_98);
    local_d8 = (BuiltinFunction *)CONCAT44(local_d8._4_4_,5);
    local_a0 = Allocator::
               make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                         (this->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                 *)local_130,(TokenKind *)&local_d8,(char (*) [1])0x20bbd7,
                          (char (*) [1])0x20bbd7);
    ::std::
    vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
    ::
    emplace_back<jsonnet::internal::ObjectField::Hide,jsonnet::internal::LiteralString*,jsonnet::internal::LiteralString*>
              (local_b0,&local_cc,(LiteralString **)&local_c8,&local_a0);
    if ((Identifier *)local_130._0_8_ != (Identifier *)(local_130 + 0x10)) {
      operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_110._M_allocated_capacity != &local_100) {
      operator_delete((void *)local_110._M_allocated_capacity,
                      local_100._M_allocated_capacity * 4 + 4);
    }
    ::std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
    ::_M_clear(&local_48);
    return pDVar3;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&::std::cerr,"INTERNAL ERROR: std.jsonnet not an object.",0x2a);
  ::std::endl<char,std::char_traits<char>>((ostream *)&::std::cerr);
  abort();
}

Assistant:

DesugaredObject *stdlibAST(std::string filename) {
        // Now, implement the std library by wrapping in a local construct.
        Tokens tokens = jsonnet_lex("std.jsonnet", STD_CODE);
        AST *std_ast = jsonnet_parse(alloc, tokens);
        desugar(std_ast, 0);
        auto *std_obj = dynamic_cast<DesugaredObject *>(std_ast);
        if (std_obj == nullptr) {
            std::cerr << "INTERNAL ERROR: std.jsonnet not an object." << std::endl;
            std::abort();
        }

        // Bind 'std' builtins that are implemented natively.
        DesugaredObject::Fields &fields = std_obj->fields;
        for (unsigned long c = 0; c <= max_builtin; ++c) {
            const auto &decl = jsonnet_builtin_decl(c);
            Identifiers params;
            for (const auto &p : decl.params)
                params.push_back(id(p));
            auto name = str(decl.name);
            auto fn = make<BuiltinFunction>(E, encode_utf8(decl.name), params);
            auto field = std::find_if(fields.begin(), fields.end(),
                [=](const DesugaredObject::Field& f) {
                    return static_cast<LiteralString*>(f.name)->value == decl.name;
                });
            if (field != fields.end()) {
                field->body = fn;
            } else {
                fields.emplace_back(ObjectField::HIDDEN, name, fn);
            }
        }
        fields.emplace_back(
            ObjectField::HIDDEN, str(U"thisFile"), str(decode_utf8(filename)));
        return std_obj;
    }